

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O3

llm_graph_input_attn_kv_unified * __thiscall
llm_graph_context::build_attn_inp_kv_unified(llm_graph_context *this)

{
  undefined4 uVar1;
  llama_memory_i *plVar2;
  llm_graph_result *plVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> tVar6;
  long lVar7;
  pointer *__ptr;
  long *plVar8;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_28;
  
  plVar2 = this->memory;
  tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       operator_new(0x40);
  *(undefined ***)
   tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
   super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl = &PTR__llm_graph_input_i_00285cf0
  ;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = 0;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x18) = 0;
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x20) = 0;
  uVar1 = *(undefined4 *)((long)&this->hparams + 4);
  uVar4 = *(undefined4 *)&this->cparams;
  uVar5 = *(undefined4 *)((long)&this->cparams + 4);
  *(undefined4 *)
   ((long)tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x28) =
       *(undefined4 *)&this->hparams;
  *(undefined4 *)
   ((long)tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x2c) = uVar1;
  *(undefined4 *)
   ((long)tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x30) = uVar4;
  *(undefined4 *)
   ((long)tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x34) = uVar5;
  *(llama_memory_i **)
   ((long)tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x38) = plVar2;
  uVar1 = *(undefined4 *)((long)&plVar2[0xe]._vptr_llama_memory_i + 4);
  lVar7 = ggml_new_tensor_2d(this->ctx0,0,uVar1,(long)this->n_tokens + 0x3fU & 0xffffffffffffffc0);
  plVar8 = (long *)((long)tVar6.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8);
  *plVar8 = lVar7;
  ggml_set_input(lVar7);
  if (this->cparams->flash_attn == true) {
    lVar7 = ggml_cast(this->ctx0,*plVar8,1);
  }
  else {
    lVar7 = *plVar8;
  }
  *(long *)((long)tVar6.
                  super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x10) = lVar7;
  if (1 < this->hparams->n_swa_pattern) {
    if (this->hparams->n_swa == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x55f,"GGML_ASSERT(%s) failed","hparams.n_swa > 0");
    }
    lVar7 = ggml_new_tensor_2d(this->ctx0,0,uVar1,(long)this->n_tokens + 0x3fU & 0xffffffffffffffc0)
    ;
    *(long *)((long)tVar6.
                    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                    .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x18) = lVar7;
    ggml_set_input(lVar7);
    if (this->cparams->flash_attn == true) {
      lVar7 = ggml_cast(this->ctx0,
                        *(long *)((long)tVar6.
                                        super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                                        .super__Head_base<0UL,_llm_graph_input_i_*,_false>.
                                        _M_head_impl + 0x18),1);
    }
    else {
      lVar7 = *(long *)((long)tVar6.
                              super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                              .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x18
                       );
    }
    *(long *)((long)tVar6.
                    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                    .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 0x20) = lVar7;
  }
  plVar3 = (this->res)._M_t.
           super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
           super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
           super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl;
  local_28._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
       super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
  ::emplace_back<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>
            ((vector<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>,std::allocator<std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>>>
              *)&plVar3->inputs,
             (unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)&local_28);
  tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
  super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_> *)
        &(*(pointer *)
           ((long)&(plVar3->inputs).
                   super__Vector_base<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>,_std::allocator<std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>_>_>
           + 8))[-1]._M_t.
         super___uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>;
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_28._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  return (llm_graph_input_attn_kv_unified *)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         tVar6.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
         super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl;
}

Assistant:

llm_graph_input_attn_kv_unified * llm_graph_context::build_attn_inp_kv_unified() const {
    const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

    auto inp = std::make_unique<llm_graph_input_attn_kv_unified>(hparams, cparams, kv_self);

    const auto n_kv = kv_self->n;

    inp->self_kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_kv, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    //cb(inp->self_kq_mask, "KQ_mask", -1);
    ggml_set_input(inp->self_kq_mask);

    inp->self_kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->self_kq_mask, GGML_TYPE_F16) : inp->self_kq_mask;

    if (hparams.n_swa_pattern > 1) {
        GGML_ASSERT(hparams.n_swa > 0);

        inp->self_kq_mask_swa = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_kv, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
        //cb(inp->self_kq_mask_swa, "KQ_mask_swa", -1);
        ggml_set_input(inp->self_kq_mask_swa);

        inp->self_kq_mask_swa_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->self_kq_mask_swa, GGML_TYPE_F16) : inp->self_kq_mask_swa;
    }

    return (llm_graph_input_attn_kv_unified *) res->add_input(std::move(inp));
}